

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

bool __thiscall
MotionBase::GetValuesAtTime(MotionBase *this,double t,double *p,double *v,double *a,bool extend)

{
  double dVar1;
  double tr;
  bool extend_local;
  double *a_local;
  double *v_local;
  double *p_local;
  double t_local;
  MotionBase *this_local;
  
  if (((this->tf <= 0.0 && this->tf != 0.0) || (t <= this->tf + 1e-09)) || (extend)) {
    dVar1 = t - this->t0;
    *p = this->accel * 0.5 * dVar1 * dVar1 + this->v0 * dVar1 + this->p0;
    *v = this->accel * dVar1 + this->v0;
    *a = this->accel;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MotionBase::GetValuesAtTime(double t, double &p, double &v, double &a, bool extend) const
{
    if ((tf < 0) || (t <= (tf+TINY)) || extend) {
        double tr = t-t0;   // time relative to start of motion
        p = p0 + v0*tr + 0.5*accel*tr*tr;
        v = v0 + accel*tr;
        a = accel;
        return true;
    }
    return false;
}